

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O0

errno_t strncpy_s(char *_Dst,size_t _SizeInBytes,char *_Src,size_t _Count)

{
  char cVar1;
  undefined1 *puVar2;
  bool bVar3;
  size_t local_40;
  size_t available;
  char *p;
  size_t _Count_local;
  char *_Src_local;
  size_t _SizeInBytes_local;
  char *_Dst_local;
  
  if (((_Count == 0) && (_Dst == (char *)0x0)) && (_SizeInBytes == 0)) {
    _Dst_local._4_4_ = 0;
  }
  else if ((_Dst == (char *)0x0) || (_SizeInBytes == 0)) {
    _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
    _Dst_local._4_4_ = 0x16;
  }
  else if (_Count == 0) {
    *_Dst = '\0';
    if (1 < _SizeInBytes) {
      memset(_Dst + 1,0xfd,_SizeInBytes - 1);
    }
    _Dst_local._4_4_ = 0;
  }
  else if (_Src == (char *)0x0) {
    *_Dst = '\0';
    if (1 < _SizeInBytes) {
      memset(_Dst + 1,0xfd,_SizeInBytes - 1);
    }
    _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
    _Dst_local._4_4_ = 0x16;
  }
  else {
    local_40 = _SizeInBytes;
    available = (size_t)_Dst;
    p = (char *)_Count;
    _Count_local = (size_t)_Src;
    if (_Count == 0xffffffffffffffff) {
      do {
        cVar1 = *(char *)_Count_local;
        *(char *)available = cVar1;
        bVar3 = false;
        if (cVar1 != '\0') {
          local_40 = local_40 - 1;
          bVar3 = local_40 != 0;
        }
        available = available + 1;
        _Count_local = _Count_local + 1;
      } while (bVar3);
    }
    else {
      do {
        cVar1 = *(char *)_Count_local;
        puVar2 = (undefined1 *)(available + 1);
        *(char *)available = cVar1;
        bVar3 = false;
        if (cVar1 != '\0') {
          local_40 = local_40 - 1;
          bVar3 = false;
          if (local_40 != 0) {
            p = p + -1;
            bVar3 = p != (char *)0x0;
          }
        }
        available = (size_t)puVar2;
        _Count_local = _Count_local + 1;
      } while (bVar3);
      if (p == (char *)0x0) {
        *puVar2 = 0;
      }
    }
    if (local_40 == 0) {
      if (p == &DAT_ffffffffffffffff) {
        _Dst[_SizeInBytes - 1] = '\0';
        _Dst_local._4_4_ = 0x50;
      }
      else {
        *_Dst = '\0';
        if (1 < _SizeInBytes) {
          memset(_Dst + 1,0xfd,_SizeInBytes - 1);
        }
        _invalid_parameter((WCHAR *)0x0,(WCHAR *)0x0,(WCHAR *)0x0,0,0);
        _Dst_local._4_4_ = 0x22;
      }
    }
    else {
      if ((_SizeInBytes - local_40) + 1 < _SizeInBytes) {
        memset(_Dst + (_SizeInBytes - local_40) + 1,0xfd,local_40 - 1);
      }
      _Dst_local._4_4_ = 0;
    }
  }
  return _Dst_local._4_4_;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl strncpy_s(char *_Dst, size_t _SizeInBytes, const char *_Src, size_t _Count)
{
    char *p;
    size_t available;

    if (_Count == 0 && _Dst == nullptr && _SizeInBytes == 0)
    {
        /* this case is allowed; nothing to do */
        return 0;
    }

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInBytes);
    if (_Count == 0)
    {
        /* notice that the source string pointer can be nullptr in this case */
        _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
        return 0;
    }
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInBytes);

    p = _Dst;
    available = _SizeInBytes;
    if (_Count == _TRUNCATE)
    {
        while ((*p++ = *_Src++) != 0 && --available > 0)
        {
        }
    }
    else
    {
        while ((*p++ = *_Src++) != 0 && --available > 0 && --_Count > 0)
        {
        }
        if (_Count == 0)
        {
            *p = 0;
        }
    }

    if (available == 0)
    {
        if (_Count == _TRUNCATE)
        {
            _Dst[_SizeInBytes - 1] = 0;
            return STRUNCATE;
        }
        _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInBytes);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInBytes, _SizeInBytes - available + 1);
    return 0;
}